

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

Gia_Man_t * Gia_ManFromIfLogic(If_Man_t *pIfMan)

{
  If_Cut_t *pCut;
  If_Obj_t *pIfObj;
  void *pvVar1;
  Gia_Obj_t *pGVar2;
  word *pwVar3;
  Vec_Mem_t *pVVar4;
  word wVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Vec_Int_t *p;
  int *piVar11;
  Vec_Int_t *p_00;
  Vec_Str_t *vConfigsStr;
  char *pcVar12;
  Gia_Man_t *pNew;
  Vec_Int_t *vLits;
  Vec_Int_t *vCover;
  Vec_Int_t *p_01;
  Vec_Int_t *vLeavesTemp;
  Vec_Ptr_t *pVVar13;
  Gia_Obj_t *pGVar14;
  word *pwVar15;
  size_t sVar16;
  char *__dest;
  FILE *__s;
  byte bVar17;
  int Fill;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  If_Par_t *pIVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  word *pwVar27;
  Vec_Int_t *local_458;
  sat_solver *local_450;
  Vec_Int_t *local_448;
  char Buffer [1000];
  
  pIVar22 = pIfMan->pPars;
  iVar8 = pIVar22->fDeriveLuts;
  if ((iVar8 != 0) && (pIVar22->fTruth == 0)) {
    __assert_fail("!pIfMan->pPars->fDeriveLuts || pIfMan->pPars->fTruth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x702,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  iVar9 = pIfMan->vObjs->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar7 = iVar9;
  }
  p->nCap = iVar7;
  if (iVar7 == 0) {
    p->pArray = (int *)0x0;
    p->nSize = iVar9;
  }
  else {
    piVar11 = (int *)malloc((long)iVar7 << 2);
    p->pArray = piVar11;
    p->nSize = iVar9;
    if (piVar11 != (int *)0x0) {
      memset(piVar11,0,(long)iVar9 << 2);
    }
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  piVar11 = (int *)malloc(0x40);
  p_00->pArray = piVar11;
  p_00->nSize = 1;
  if (piVar11 != (int *)0x0) {
    *piVar11 = 0;
  }
  if ((iVar8 == 0) ||
     ((((pIVar22->pLutStruct == (char *)0x0 && (pIVar22->fEnableCheck75 == 0)) &&
       (pIVar22->fEnableCheck75u == 0)) && (pIVar22->fEnableCheck07 == 0)))) {
    local_458 = (Vec_Int_t *)0x0;
  }
  else {
    local_458 = (Vec_Int_t *)malloc(0x10);
    local_458->nCap = 1000;
    local_458->nSize = 0;
    piVar11 = (int *)malloc(4000);
    local_458->pArray = piVar11;
    Vec_IntPush(local_458,0);
    pIVar22 = pIfMan->pPars;
  }
  if (pIVar22->fUseDsdTune == 0) {
    vConfigsStr = (Vec_Str_t *)0x0;
    local_448 = (Vec_Int_t *)0x0;
  }
  else {
    iVar8 = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
    iVar9 = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
    uVar10 = iVar9 + iVar8 + 1;
    local_448 = (Vec_Int_t *)malloc(0x10);
    local_448->nCap = 1000;
    local_448->nSize = 0;
    piVar11 = (int *)malloc(4000);
    local_448->pArray = piVar11;
    Vec_IntPush(local_448,0);
    Vec_IntPush(local_448,(((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0));
    vConfigsStr = (Vec_Str_t *)malloc(0x10);
    vConfigsStr->nCap = 1000;
    vConfigsStr->nSize = 0;
    pcVar12 = (char *)malloc(1000);
    vConfigsStr->pArray = pcVar12;
  }
  pNew = Gia_ManStart(pIfMan->vObjs->nSize);
  vLits = (Vec_Int_t *)malloc(0x10);
  vLits->nCap = 1000;
  vLits->nSize = 0;
  piVar11 = (int *)malloc(4000);
  vLits->pArray = piVar11;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar11 = (int *)malloc(0x40000);
  vCover->pArray = piVar11;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 0x10;
  p_01->nSize = 0;
  piVar11 = (int *)malloc(0x40);
  p_01->pArray = piVar11;
  vLeavesTemp = (Vec_Int_t *)malloc(0x10);
  vLeavesTemp->nCap = 0x10;
  vLeavesTemp->nSize = 0;
  piVar11 = (int *)malloc(0x40);
  vLeavesTemp->pArray = piVar11;
  If_ManCleanCutData(pIfMan);
  pVVar13 = pIfMan->vObjs;
  if (pVVar13->nSize < 1) {
    local_450 = (sat_solver *)0x0;
  }
  else {
    lVar18 = 0;
    local_450 = (sat_solver *)0x0;
    do {
      pIfObj = (If_Obj_t *)pVVar13->pArray[lVar18];
      uVar10 = *(uint *)pIfObj;
      if ((uVar10 & 0xe) != 2 && pIfObj->nRefs == 0) goto LAB_00213b34;
      switch(uVar10 & 0xf) {
      case 1:
        (pIfObj->field_22).iCopy = 1;
        if (p->nSize < 1) goto LAB_00214797;
        *p->pArray = p_00->nSize;
        Vec_IntPush(p_00,0);
        Vec_IntPush(p_00,0);
        break;
      case 2:
        pGVar14 = Gia_ManAppendObj(pNew);
        uVar20 = *(ulong *)pGVar14;
        *(ulong *)pGVar14 = uVar20 | 0x9fffffff;
        *(ulong *)pGVar14 =
             uVar20 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = pNew->pObjs;
        if ((pGVar14 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar14)) {
LAB_002146fc:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar14 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = pNew->pObjs;
        if ((pGVar14 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar14)) goto LAB_002146fc;
        iVar8 = (int)((ulong)((long)pGVar14 - (long)pGVar2) >> 2) * 0x55555556;
        goto LAB_00213b30;
      case 3:
        uVar21 = (pIfObj->pFanin0->field_22).iCopy;
        if ((int)uVar21 < 0) goto LAB_00214759;
        iVar8 = Gia_ManAppendCo(pNew,uVar21 ^ uVar10 >> 4 & 1);
LAB_00213b30:
        (pIfObj->field_22).iCopy = iVar8;
        break;
      case 4:
        pCut = &pIfObj->CutBest;
        pIVar22 = pIfMan->pPars;
        if (((((pIVar22->fUseTtPerm == 0) && (pIVar22->fDelayOpt == 0)) &&
             ((pIVar22->fDelayOptLut == 0 &&
              ((pIVar22->fDsdBalance == 0 && (pIVar22->pLutStruct == (char *)0x0)))))) &&
            (pIVar22->fUserRecLib == 0)) &&
           (((((pIVar22->fUserSesLib == 0 && (pIVar22->nGateSize == 0)) &&
              (pIVar22->fEnableCheck75 == 0)) &&
             ((pIVar22->fEnableCheck75u == 0 && (pIVar22->fEnableCheck07 == 0)))) &&
            ((pIVar22->fUseDsdTune == 0 &&
             ((pIVar22->fUseCofVars == 0 && (pIVar22->fUseAndVars == 0)))))))) {
          If_CutRotatePins(pIfMan,pCut);
        }
        p_01->nSize = 0;
        uVar10 = *(uint *)&(pIfObj->CutBest).field_0x1c;
        uVar20 = (ulong)(uVar10 >> 0x18);
        if (0xffffff < uVar10) {
          uVar23 = 0;
          do {
            iVar8 = *(int *)(&pIfObj[1].field_0x0 + uVar23 * 4);
            if (((long)iVar8 < 0) || (pIfMan->vObjs->nSize <= iVar8)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar1 = pIfMan->vObjs->pArray[iVar8];
            if (pvVar1 == (void *)0x0) break;
            Vec_IntPush(p_01,*(int *)((long)pvVar1 + 0x40));
            uVar23 = uVar23 + 1;
            uVar20 = (ulong)(byte)(pIfObj->CutBest).field_0x1f;
          } while (uVar23 < uVar20);
        }
        pIVar22 = pIfMan->pPars;
        iVar8 = pIVar22->fUseDsd;
        if ((iVar8 == 0) || (pIVar22->pLutStruct == (char *)0x0)) {
          iVar9 = (int)uVar20;
          if (pIVar22->fUseAndVars == 0) {
LAB_00213c67:
            if (pIVar22->fUseCofVars == 0) goto LAB_00213cb1;
LAB_00213c6b:
            if (pIVar22->fDeriveLuts != 0) {
              if (pIVar22->nLutSize / 2 < iVar9) goto LAB_00213c83;
              goto LAB_00213cba;
            }
LAB_00213cc4:
            if (iVar8 == 0) {
LAB_00213cc8:
              if ((pIVar22->fUseTtPerm == 0) &&
                 (pIVar22->pFuncCell2 ==
                  (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)) {
                uVar10 = Gia_ManNodeIfToGia(pNew,pIfMan,pIfObj,p_01,0);
                (pIfObj->field_22).iCopy = uVar10;
                if ((int)uVar10 < 0) {
LAB_00214778:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                uVar10 = uVar10 >> 1;
                iVar8 = p_00->nSize;
                Vec_IntFillExtra(p,uVar10 + 1,Fill);
                if (p->nSize <= (int)uVar10) {
LAB_00214797:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                p->pArray[uVar10] = iVar8;
                Vec_IntPush(p_00,p_01->nSize);
                iVar8 = p_01->nSize;
                if (0 < (long)iVar8) {
                  lVar19 = 0;
                  do {
                    if ((p_01->pArray[lVar19] < 0) || ((pIfObj->field_22).iCopy < 0))
                    goto LAB_00214778;
                    if ((uint)(pIfObj->field_22).iCopy >> 1 <= (uint)p_01->pArray[lVar19] >> 1) {
                      __assert_fail("Abc_Lit2Var(Entry) < Abc_Lit2Var(pIfObj->iCopy)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                                    ,0x773,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
                    }
                    lVar19 = lVar19 + 1;
                  } while (iVar8 != lVar19);
                  if (0 < iVar8) {
                    lVar19 = 0;
                    do {
                      if (p_01->pArray[lVar19] < 0) goto LAB_00214778;
                      Vec_IntPush(p_00,(uint)p_01->pArray[lVar19] >> 1);
                      lVar19 = lVar19 + 1;
                    } while (lVar19 < p_01->nSize);
                  }
                }
                if ((pIfObj->field_22).iCopy < 0) goto LAB_00214778;
                Vec_IntPush(p_00,(uint)(pIfObj->field_22).iCopy >> 1);
                break;
              }
            }
          }
          else {
            if (pIVar22->fUseCofVars != 0) {
              if (pIVar22->fDeriveLuts == 0) goto LAB_00213c6b;
              if (iVar9 <= pIVar22->nLutSize / 2) goto LAB_00213c2c;
              uVar10 = (pIfObj->CutBest).iCutFunc;
              if ((int)uVar10 < 0) goto LAB_00214778;
              uVar10 = uVar10 >> 1;
              if ((int)uVar10 < pIfMan->vTtDecs[uVar20]->nSize) {
                if (pIfMan->vTtDecs[uVar20]->pArray[uVar10] != 0) goto LAB_00213c40;
LAB_00213c83:
                iVar8 = Gia_ManFromIfLogicCofVars(pNew,pIfMan,pCut,p_01,vLeavesTemp,vCover,p,p_00);
                goto LAB_00213b30;
              }
              goto LAB_0021469f;
            }
            if (pIVar22->fDeriveLuts != 0) {
LAB_00213c2c:
              if (pIVar22->nLutSize / 2 < iVar9) {
LAB_00213c40:
                iVar8 = Gia_ManFromIfLogicAndVars(pNew,pIfMan,pCut,p_01,vLeavesTemp,vCover,p,p_00);
                goto LAB_00213b30;
              }
              goto LAB_00213c67;
            }
LAB_00213cb1:
            if (pIVar22->fDeriveLuts == 0) goto LAB_00213cc4;
LAB_00213cba:
            if (iVar8 == 0 && pIVar22->fTruth == 0) goto LAB_00213cc8;
          }
          uVar10 = (pIfObj->CutBest).iCutFunc;
          if ((int)uVar10 < 0) goto LAB_002147d5;
          pwVar3 = pIfMan->puTempW;
          pVVar4 = pIfMan->vTtMem[uVar20];
          if (pVVar4 == (Vec_Mem_t *)0x0) {
            pwVar15 = (word *)0x0;
          }
          else {
            uVar21 = uVar10 >> 1;
            if (pVVar4->nEntries <= (int)uVar21) goto LAB_0021488f;
            pwVar15 = pVVar4->ppPages[uVar21 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                      (ulong)(uVar21 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
          }
          uVar21 = pIfMan->nTruth6Words[uVar20];
          if ((uVar10 & 1) == 0) {
            if (0 < (int)uVar21) {
              uVar20 = 0;
              do {
                pwVar3[uVar20] = pwVar15[uVar20];
                uVar20 = uVar20 + 1;
              } while (uVar21 != uVar20);
            }
          }
          else if (0 < (int)uVar21) {
            uVar20 = 0;
            do {
              pwVar3[uVar20] = ~pwVar15[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar21 != uVar20);
          }
          if ((pIVar22->fUseTtPerm != 0) &&
             (uVar10 = *(uint *)&(pIfObj->CutBest).field_0x1c, 0xffffff < uVar10)) {
            uVar23 = (ulong)(uVar10 >> 0x18);
            uVar21 = (pIfObj->CutBest).uMaskFunc;
            uVar20 = 0;
            do {
              if ((uVar21 >> ((uint)uVar20 & 0x1f) & 1) != 0) {
                iVar8 = (int)uVar23 + -6;
                uVar25 = 1 << ((byte)iVar8 & 0x1f);
                bVar17 = (byte)(1 << ((byte)uVar20 & 0x1f));
                if ((uVar10 < 0x7000000) || (iVar8 == 0)) {
                  *pwVar3 = (Gia_ManFromIfLogicNode::Truth6[uVar20] & *pwVar3) >> (bVar17 & 0x3f) |
                            *pwVar3 << (bVar17 & 0x3f) & Gia_ManFromIfLogicNode::Truth6[uVar20];
                }
                else if (uVar20 < 6) {
                  if (iVar8 != 0x1f) {
                    uVar23 = Gia_ManFromIfLogicNode::Truth6[uVar20];
                    uVar24 = 0;
                    do {
                      pwVar3[uVar24] =
                           (pwVar3[uVar24] & uVar23) >> (bVar17 & 0x3f) |
                           pwVar3[uVar24] << (bVar17 & 0x3f) & uVar23;
                      uVar24 = uVar24 + 1;
                    } while (uVar25 != uVar24);
                  }
                }
                else if (iVar8 != 0x1f) {
                  bVar17 = (byte)(uVar20 - 6);
                  uVar10 = 1 << (bVar17 & 0x1f);
                  iVar8 = 2 << (bVar17 & 0x1f);
                  uVar23 = 1;
                  if (1 < (int)uVar10) {
                    uVar23 = (ulong)uVar10;
                  }
                  pwVar15 = pwVar3 + (int)uVar10;
                  pwVar27 = pwVar3;
                  do {
                    if (uVar20 - 6 != 0x1f) {
                      uVar24 = 0;
                      do {
                        wVar5 = pwVar27[uVar24];
                        pwVar27[uVar24] = pwVar15[uVar24];
                        pwVar15[uVar24] = wVar5;
                        uVar24 = uVar24 + 1;
                      } while (uVar23 != uVar24);
                    }
                    pwVar27 = pwVar27 + iVar8;
                    pwVar15 = pwVar15 + iVar8;
                  } while (pwVar27 < pwVar3 + (int)uVar25);
                }
              }
              uVar20 = uVar20 + 1;
              uVar10 = *(uint *)&(pIfObj->CutBest).field_0x1c;
              uVar23 = (ulong)(uVar10 >> 0x18);
            } while (uVar20 < uVar23);
          }
          uVar10 = 1;
          if (pIVar22->fEnableCheck75 == 0) {
            uVar10 = (uint)(pIVar22->fEnableCheck75u != 0);
          }
          uVar10 = Gia_ManFromIfLogicNode
                             (pIfMan,pNew,(int)lVar18,p_01,vLeavesTemp,pwVar3,pIVar22->pLutStruct,
                              vCover,p,p_00,local_458,uVar10,pIVar22->fEnableCheck07);
          (pIfObj->field_22).iCopy = uVar10;
          if ((int)uVar10 < 0) goto LAB_00214759;
          uVar21 = *(uint *)&(pIfObj->CutBest).field_0x1c >> 0xc & 1 ^ uVar10;
          (pIfObj->field_22).iCopy = uVar21;
          if ((local_448 != (Vec_Int_t *)0x0) && (1 < p_01->nSize)) {
            if (pNew->nObjs <= (int)(uVar10 >> 1)) goto LAB_00214680;
            if ((1 < uVar10) &&
               (((uint)*(undefined8 *)(pNew->pObjs + (uVar10 >> 1)) & 0x9fffffff) != 0x9fffffff)) {
              Gia_ManFromIfGetConfig(local_448,pIfMan,pCut,uVar21,vConfigsStr);
            }
          }
        }
        else {
          if (local_450 == (sat_solver *)0x0) {
            local_450 = (sat_solver *)If_ManSatBuildXY(*pIVar22->pLutStruct + -0x30);
            pIVar22 = pIfMan->pPars;
            if (pIVar22->pLutStruct != (char *)0x0) goto LAB_00213a41;
LAB_00213bc2:
            uVar10 = (pIfObj->CutBest).iCutFunc;
            if ((int)uVar10 < 0) {
LAB_002147d5:
              __assert_fail("pCut->iCutFunc >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/if.h"
                            ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
            }
            pwVar3 = pIfMan->puTempW;
            bVar17 = (pIfObj->CutBest).field_0x1f;
            pVVar4 = pIfMan->vTtMem[bVar17];
            if (pVVar4 == (Vec_Mem_t *)0x0) {
              pwVar15 = (word *)0x0;
            }
            else {
              uVar21 = uVar10 >> 1;
              if (pVVar4->nEntries <= (int)uVar21) {
LAB_0021488f:
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              pwVar15 = pVVar4->ppPages[uVar21 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                        (ulong)(uVar21 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
            }
            uVar21 = pIfMan->nTruth6Words[bVar17];
            if ((uVar10 & 1) == 0) {
              if (0 < (int)uVar21) {
                uVar20 = 0;
                do {
                  pwVar3[uVar20] = pwVar15[uVar20];
                  uVar20 = uVar20 + 1;
                } while (uVar21 != uVar20);
              }
            }
            else if (0 < (int)uVar21) {
              uVar20 = 0;
              do {
                pwVar3[uVar20] = ~pwVar15[uVar20];
                uVar20 = uVar20 + 1;
              } while (uVar21 != uVar20);
            }
            uVar10 = Gia_ManFromIfLogicCreateLut(pNew,pwVar3,p_01,vCover,p,p_00);
          }
          else {
LAB_00213a41:
            if (pIVar22->fDeriveLuts == 0) goto LAB_00213bc2;
            uVar10 = Gia_ManFromIfLogicFindLut
                               (pIfMan,pNew,pCut,local_450,p_01,vLits,vCover,p,p_00,local_458);
          }
          (pIfObj->field_22).iCopy = uVar10;
          if ((int)uVar10 < 0) {
LAB_00214759:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          (pIfObj->field_22).iCopy = *(uint *)&(pIfObj->CutBest).field_0x1c >> 0xc & 1 ^ uVar10;
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                      ,0x785,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
      }
LAB_00213b34:
      lVar18 = lVar18 + 1;
      pVVar13 = pIfMan->vObjs;
    } while (lVar18 < pVVar13->nSize);
  }
  if (vLits->pArray != (int *)0x0) {
    free(vLits->pArray);
  }
  free(vLits);
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
  }
  free(vCover);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  if (vLeavesTemp->pArray != (int *)0x0) {
    free(vLeavesTemp->pArray);
  }
  free(vLeavesTemp);
  iVar8 = extraout_EDX;
  if (local_450 != (sat_solver *)0x0) {
    sat_solver_delete(local_450);
    iVar8 = extraout_EDX_00;
  }
  iVar9 = pNew->nObjs;
  if (iVar9 < p->nSize) {
    p->nSize = iVar9;
  }
  else {
    Vec_IntFillExtra(p,iVar9,iVar8);
    iVar9 = pNew->nObjs;
    if (p->nSize != iVar9) {
      __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x798,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
    }
  }
  if (0 < iVar9) {
    piVar11 = p->pArray;
    lVar18 = 0;
    do {
      iVar8 = piVar11[lVar18];
      if (0 < iVar8) {
        piVar11[lVar18] = iVar8 + pNew->nObjs;
        iVar9 = p->nSize;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar9);
  }
  iVar8 = p_00->nSize;
  piVar11 = p_00->pArray;
  if ((long)iVar8 < 1) {
    if (piVar11 != (int *)0x0) goto LAB_00214232;
  }
  else {
    lVar18 = 0;
    do {
      Vec_IntPush(p,piVar11[lVar18]);
      lVar18 = lVar18 + 1;
    } while (iVar8 != lVar18);
LAB_00214232:
    free(piVar11);
  }
  free(p_00);
  if (pNew->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x79f,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  if (pNew->vPacking != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vPacking == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x7a0,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  if (pNew->vConfigs != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vConfigs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x7a1,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  if (pNew->pCellStr != (char *)0x0) {
    __assert_fail("pNew->pCellStr == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x7a2,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  pNew->vMapping = p;
  pNew->vPacking = local_458;
  pNew->vConfigs = local_448;
  if (local_448 == (Vec_Int_t *)0x0) {
    pNew->pCellStr = (char *)0x0;
  }
  else {
    pcVar12 = If_DsdManGetCellStr(pIfMan->pIfDsdMan);
    if (pcVar12 == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar16 = strlen(pcVar12);
      __dest = (char *)malloc(sVar16 + 1);
      strcpy(__dest,pcVar12);
    }
    pNew->pCellStr = __dest;
    iVar8 = local_448->nSize;
    if ((iVar8 < 1) || (iVar8 == 1)) {
LAB_0021469f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (iVar8 != local_448->pArray[1] * *local_448->pArray + 2) {
      __assert_fail("!vConfigs || Vec_IntSize(vConfigs) == 2 + Vec_IntEntry(vConfigs, 0) * Vec_IntEntry(vConfigs, 1)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x7a7,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
    }
  }
  lVar18 = (long)pNew->vCos->nSize;
  if (lVar18 < 1) {
    uVar10 = pNew->nObjs;
  }
  else {
    lVar19 = 0;
    do {
      iVar8 = pNew->vCos->pArray[lVar19];
      if (((long)iVar8 < 0) || (uVar10 = pNew->nObjs, (int)uVar10 <= iVar8)) goto LAB_00214680;
      if (pNew->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = pNew->pObjs + iVar8;
      uVar25 = (uint)*(undefined8 *)pGVar2;
      uVar21 = *(uint *)(pGVar2 + -(ulong)(uVar25 & 0x1fffffff));
      if ((~uVar21 & 0x1fffffff) != 0 && -1 < (int)uVar21) {
        uVar21 = iVar8 - (uVar25 & 0x1fffffff);
        if (((int)uVar21 < 0) || (pNew->vMapping->nSize <= (int)uVar21)) goto LAB_0021469f;
        if (pNew->vMapping->pArray[uVar21] == 0) {
          __assert_fail("!Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                        ,0x7ac,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar18 != lVar19);
  }
  if (1 < (int)uVar10) {
    uVar21 = pNew->vMapping->nSize;
    uVar20 = 1;
    if (1 < (int)uVar21) {
      uVar20 = (ulong)uVar21;
    }
    uVar23 = 1;
    do {
      if (uVar23 == uVar20) goto LAB_0021469f;
      piVar11 = pNew->vMapping->pArray;
      uVar25 = piVar11[uVar23];
      uVar24 = (ulong)uVar25;
      if (uVar24 != 0) {
        if (((int)uVar25 < 0) || (uVar21 <= uVar25)) goto LAB_0021469f;
        uVar25 = piVar11[uVar24];
        uVar6 = uVar25;
        if ((int)uVar25 < 1) {
          uVar6 = 0;
        }
        if (0 < (int)uVar25) {
          uVar26 = 0;
          do {
            uVar25 = piVar11[uVar24 + uVar26 + 1];
            if (uVar10 <= uVar25) goto LAB_00214680;
            if ((~*(uint *)(pNew->pObjs + uVar25) & 0x1fffffff) != 0 &&
                -1 < (int)*(uint *)(pNew->pObjs + uVar25)) {
              if ((int)uVar21 <= (int)uVar25) goto LAB_0021469f;
              if (piVar11[uVar25] == 0) {
                __assert_fail("!Gia_ObjIsAnd(pFanin) || Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pFanin))"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                              ,0x7b3,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
              }
            }
            uVar26 = uVar26 + 1;
          } while (uVar6 != uVar26);
        }
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar10);
  }
  lVar18 = (long)pNew->vCis->nSize;
  if (0 < lVar18) {
    lVar19 = 0;
    do {
      iVar8 = pNew->vCis->pArray[lVar19];
      if (((long)iVar8 < 0) || ((int)uVar10 <= iVar8)) {
LAB_00214680:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pNew->pObjs == (Gia_Obj_t *)0x0) break;
      if (pNew->vMapping->nSize <= iVar8) goto LAB_0021469f;
      if (pNew->vMapping->pArray[iVar8] != 0) {
        __assert_fail("!Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                      ,0x7b9,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
      }
      lVar19 = lVar19 + 1;
    } while (lVar18 != lVar19);
  }
  if (vConfigsStr == (Vec_Str_t *)0x0) {
    return pNew;
  }
  memset(Buffer,0,1000);
  if (pIfMan->pName == (char *)0x0) {
    pcVar12 = "nameless_";
    sprintf(Buffer,"%s_configs.txt","nameless_");
  }
  else {
    pcVar12 = Extra_FileNameGeneric(pIfMan->pName);
    sprintf(Buffer,"%s_configs.txt",pcVar12);
    if (pcVar12 == (char *)0x0) goto LAB_0021455d;
  }
  free(pcVar12);
LAB_0021455d:
  __s = fopen(Buffer,"wb");
  if (__s == (FILE *)0x0) {
    if (vConfigsStr->pArray != (char *)0x0) {
      free(vConfigsStr->pArray);
    }
    free(vConfigsStr);
    pcVar12 = "Cannot open file \"%s\".\n";
  }
  else {
    uVar10 = vConfigsStr->nSize;
    if (uVar10 == vConfigsStr->nCap) {
      if ((int)uVar10 < 0x10) {
        if (vConfigsStr->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(0x10);
        }
        else {
          pcVar12 = (char *)realloc(vConfigsStr->pArray,0x10);
        }
        vConfigsStr->pArray = pcVar12;
        vConfigsStr->nCap = 0x10;
      }
      else {
        sVar16 = (ulong)uVar10 * 2;
        if (vConfigsStr->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(sVar16);
        }
        else {
          pcVar12 = (char *)realloc(vConfigsStr->pArray,sVar16);
        }
        vConfigsStr->pArray = pcVar12;
        vConfigsStr->nCap = (int)sVar16;
      }
    }
    else {
      pcVar12 = vConfigsStr->pArray;
    }
    iVar8 = vConfigsStr->nSize;
    vConfigsStr->nSize = iVar8 + 1;
    pcVar12[iVar8] = '\0';
    pcVar12 = vConfigsStr->pArray;
    sVar16 = strlen(pcVar12);
    fwrite(pcVar12,sVar16,1,__s);
    if (vConfigsStr->pArray != (char *)0x0) {
      free(vConfigsStr->pArray);
    }
    free(vConfigsStr);
    fclose(__s);
    pcVar12 = "Finished dumping configs into file \"%s\".\n";
  }
  printf(pcVar12,Buffer);
  return pNew;
}

Assistant:

Gia_Man_t * Gia_ManFromIfLogic( If_Man_t * pIfMan )
{
    int fWriteConfigs = 1;
    Gia_Man_t * pNew, * pHashed = NULL;
    If_Cut_t * pCutBest;
    If_Obj_t * pIfObj, * pIfLeaf;
    Vec_Int_t * vMapping, * vMapping2, * vPacking = NULL, * vConfigs = NULL;
    Vec_Int_t * vLeaves, * vLeaves2, * vCover, * vLits;
    Vec_Str_t * vConfigsStr = NULL;
    Ifn_Ntk_t * pNtkCell = NULL;
    sat_solver * pSat = NULL;
    int i, k, Entry;
    assert( !pIfMan->pPars->fDeriveLuts || pIfMan->pPars->fTruth );
//    if ( pIfMan->pPars->fEnableCheck07 )
//        pIfMan->pPars->fDeriveLuts = 0;
    // start mapping and packing
    vMapping  = Vec_IntStart( If_ManObjNum(pIfMan) );
    vMapping2 = Vec_IntStart( 1 );
    if ( pIfMan->pPars->fDeriveLuts && (pIfMan->pPars->pLutStruct || pIfMan->pPars->fEnableCheck75 || pIfMan->pPars->fEnableCheck75u || pIfMan->pPars->fEnableCheck07) )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    if ( pIfMan->pPars->fUseDsdTune )
    {
        int nTtBitNum = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
        int nPermBitNum = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
        int nConfigInts = Abc_BitWordNum(nTtBitNum + nPermBitNum + 1);
        vConfigs = Vec_IntAlloc( 1000 );
        Vec_IntPush( vConfigs, 0 );
        Vec_IntPush( vConfigs, nConfigInts );
        if ( fWriteConfigs )
            vConfigsStr = Vec_StrAlloc( 1000 );
    }
    // create new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    // iterate through nodes used in the mapping
    vLits    = Vec_IntAlloc( 1000 );
    vCover   = Vec_IntAlloc( 1 << 16 );
    vLeaves  = Vec_IntAlloc( 16 );
    vLeaves2 = Vec_IntAlloc( 16 );
    If_ManCleanCutData( pIfMan );
    If_ManForEachObj( pIfMan, pIfObj, i )
    {
        if ( pIfObj->nRefs == 0 && !If_ObjIsTerm(pIfObj) )
            continue;
        if ( If_ObjIsAnd(pIfObj) )
        {
            pCutBest = If_ObjCutBest( pIfObj );
            // perform sorting of cut leaves by delay, so that the slowest pin drives the fastest input of the LUT
            if ( !pIfMan->pPars->fUseTtPerm && !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDelayOptLut && !pIfMan->pPars->fDsdBalance && 
                 !pIfMan->pPars->pLutStruct && !pIfMan->pPars->fUserRecLib && !pIfMan->pPars->fUserSesLib && !pIfMan->pPars->nGateSize && 
                 !pIfMan->pPars->fEnableCheck75 && !pIfMan->pPars->fEnableCheck75u && !pIfMan->pPars->fEnableCheck07 && !pIfMan->pPars->fUseDsdTune && 
                 !pIfMan->pPars->fUseCofVars && !pIfMan->pPars->fUseAndVars )
                If_CutRotatePins( pIfMan, pCutBest );
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, k )
                Vec_IntPush( vLeaves, pIfLeaf->iCopy );
            // perform one of the two types of mapping: with and without structures
            if ( pIfMan->pPars->fUseDsd && pIfMan->pPars->pLutStruct )
            {
                if ( pSat == NULL )
                    pSat = (sat_solver *)If_ManSatBuildXY( (int)(pIfMan->pPars->pLutStruct[0] - '0') );
                if ( pIfMan->pPars->pLutStruct && pIfMan->pPars->fDeriveLuts )
                    pIfObj->iCopy = Gia_ManFromIfLogicFindLut( pIfMan, pNew, pCutBest, pSat, vLeaves, vLits, vCover, vMapping, vMapping2, vPacking );
                else
                    pIfObj->iCopy = Gia_ManFromIfLogicCreateLut( pNew, If_CutTruthW(pIfMan, pCutBest), vLeaves, vCover, vMapping, vMapping2 );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
            }
/*
            else if ( pIfMan->pPars->fUseDsd && pIfMan->pPars->fUseDsdTune && pIfMan->pPars->fDeriveLuts )
            {
                if ( pNtkCell == NULL )
                {
                    assert( If_DsdManGetCellStr(pIfMan->pIfDsdMan) != NULL );
                    pNtkCell = Ifn_NtkParse( If_DsdManGetCellStr(pIfMan->pIfDsdMan) );
                    nLutMax = Ifn_NtkLutSizeMax( pNtkCell );
                    pHashed = Gia_ManStart( 10000 );
                    Vec_IntFillExtra( &pHashed->vCopies, 10000, -1 );
                    for ( k = 0; k < pIfMan->pPars->nLutSize; k++ )
                        Gia_ManAppendCi( pHashed );
                    Gia_ManHashAlloc( pHashed );
                }
                pIfObj->iCopy = Gia_ManFromIfLogicFindCell( pIfMan, pNew, pHashed, pCutBest, pNtkCell, nLutMax, vLeaves, vLits, vCover, vMapping, vMapping2, vConfigs );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
            }
*/
            else if ( pIfMan->pPars->fUseAndVars && pIfMan->pPars->fUseCofVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
                int Mask = Vec_IntEntry(pIfMan->vTtDecs[pCutBest->nLeaves], truthId);
                if ( Mask )
                    pIfObj->iCopy = Gia_ManFromIfLogicAndVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
                else
                    pIfObj->iCopy = Gia_ManFromIfLogicCofVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( pIfMan->pPars->fUseAndVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                pIfObj->iCopy = Gia_ManFromIfLogicAndVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( pIfMan->pPars->fUseCofVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                pIfObj->iCopy = Gia_ManFromIfLogicCofVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( (pIfMan->pPars->fDeriveLuts && pIfMan->pPars->fTruth) || pIfMan->pPars->fUseDsd || pIfMan->pPars->fUseTtPerm || pIfMan->pPars->pFuncCell2 )
            {
                word * pTruth = If_CutTruthW(pIfMan, pCutBest);
                if ( pIfMan->pPars->fUseTtPerm )
                    for ( k = 0; k < (int)pCutBest->nLeaves; k++ )
                        if ( If_CutLeafBit(pCutBest, k) )
                            Abc_TtFlip( pTruth, Abc_TtWordNum(pCutBest->nLeaves), k );
                // perform decomposition of the cut
                pIfObj->iCopy = Gia_ManFromIfLogicNode( pIfMan, pNew, i, vLeaves, vLeaves2, pTruth, pIfMan->pPars->pLutStruct, vCover, vMapping, vMapping2, vPacking, (pIfMan->pPars->fEnableCheck75 || pIfMan->pPars->fEnableCheck75u), pIfMan->pPars->fEnableCheck07 );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
                if ( vConfigs && Vec_IntSize(vLeaves) > 1 && !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(pIfObj->iCopy))) && pIfObj->iCopy > 1 )
                    Gia_ManFromIfGetConfig( vConfigs, pIfMan, pCutBest, pIfObj->iCopy, vConfigsStr );
            }
            else
            {
                pIfObj->iCopy = Gia_ManNodeIfToGia( pNew, pIfMan, pIfObj, vLeaves, 0 );
                // write mapping
                Vec_IntSetEntry( vMapping, Abc_Lit2Var(pIfObj->iCopy), Vec_IntSize(vMapping2) );
                Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    assert( Abc_Lit2Var(Entry) < Abc_Lit2Var(pIfObj->iCopy) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    Vec_IntPush( vMapping2, Abc_Lit2Var(Entry)  );
                Vec_IntPush( vMapping2, Abc_Lit2Var(pIfObj->iCopy) );
            }
        }
        else if ( If_ObjIsCi(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCi(pNew);
        else if ( If_ObjIsCo(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCo( pNew, Abc_LitNotCond(If_ObjFanin0(pIfObj)->iCopy, If_ObjFaninC0(pIfObj)) );
        else if ( If_ObjIsConst1(pIfObj) )
        {
            pIfObj->iCopy = 1;
            // create const LUT
            Vec_IntWriteEntry( vMapping, 0, Vec_IntSize(vMapping2) );
            Vec_IntPush( vMapping2, 0 );
            Vec_IntPush( vMapping2, 0 );
        }
        else assert( 0 );
    }
    Vec_IntFree( vLits );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vLeaves2 );
    if ( pNtkCell )
        ABC_FREE( pNtkCell );
    if ( pSat )
        sat_solver_delete(pSat);
    if ( pHashed )
        Gia_ManStop( pHashed );
//    printf( "Mapping array size:  IfMan = %d. Gia = %d. Increase = %.2f\n", 
//        If_ManObjNum(pIfMan), Gia_ManObjNum(pNew), 1.0 * Gia_ManObjNum(pNew) / If_ManObjNum(pIfMan) );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, Entry, i )
        if ( Entry > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    assert( pNew->vPacking == NULL );
    assert( pNew->vConfigs == NULL );
    assert( pNew->pCellStr == NULL );
    pNew->vMapping = vMapping;
    pNew->vPacking = vPacking;
    pNew->vConfigs = vConfigs;
    pNew->pCellStr = vConfigs ? Abc_UtilStrsav( If_DsdManGetCellStr(pIfMan->pIfDsdMan) ) : NULL;
    assert( !vConfigs || Vec_IntSize(vConfigs) == 2 + Vec_IntEntry(vConfigs, 0) * Vec_IntEntry(vConfigs, 1) );
    // verify that COs have mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCo( pNew, pObj, i )
           assert( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj)) );
    }
    // verify that internal nodes have mapping
    {
        Gia_Obj_t * pFanin;
        Gia_ManForEachLut( pNew, i )
            Gia_LutForEachFaninObj( pNew, i, pFanin, k )
                assert( !Gia_ObjIsAnd(pFanin) || Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pFanin)) );
    }
    // verify that CIs have no mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCi( pNew, pObj, i )
           assert( !Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pObj)) );
    }
    // dump configuration strings
    if ( vConfigsStr )
    {
        FILE * pFile; int status;
        char * pStr, Buffer[1000] = {0};
        const char * pNameGen = pIfMan->pName? Extra_FileNameGeneric( pIfMan->pName ) : "nameless_";
        sprintf( Buffer, "%s_configs.txt", pNameGen );
        ABC_FREE( pNameGen );
        pFile = fopen( Buffer, "wb" );
        if ( pFile == NULL )
        {
            Vec_StrFree( vConfigsStr );
            printf( "Cannot open file \"%s\".\n", Buffer );
            return pNew;
        }
        Vec_StrPush( vConfigsStr, '\0' );
        pStr = Vec_StrArray(vConfigsStr);
        status = fwrite( pStr, strlen(pStr), 1, pFile );
        Vec_StrFree( vConfigsStr );
        fclose( pFile );
        printf( "Finished dumping configs into file \"%s\".\n", Buffer );
    }
    return pNew;
}